

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O3

int uv_interface_addresses(uv_interface_address_t **addresses,int *count)

{
  short *psVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  uv_interface_address_t *puVar7;
  char *pcVar8;
  long *plVar9;
  long *plVar10;
  undefined4 uVar11;
  in_addr_t iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ifaddrs *addrs;
  long *local_40;
  long *local_38;
  
  *count = 0;
  *addresses = (uv_interface_address_t *)0x0;
  iVar4 = getifaddrs(&local_40);
  plVar9 = local_40;
  if (iVar4 != 0) {
    piVar6 = __errno_location();
    return -*piVar6;
  }
  for (; plVar9 != (long *)0x0; plVar9 = (long *)*plVar9) {
    if ((((~*(uint *)(plVar9 + 2) & 0x41) == 0) && ((short *)plVar9[3] != (short *)0x0)) &&
       (*(short *)plVar9[3] != 0x11)) {
      *count = *count + 1;
    }
  }
  if ((long)*count == 0) {
    freeifaddrs();
    return 0;
  }
  puVar7 = (uv_interface_address_t *)uv__malloc((long)*count * 0x50);
  *addresses = puVar7;
  if (puVar7 == (uv_interface_address_t *)0x0) {
    freeifaddrs(local_40);
    return -0xc;
  }
  plVar9 = local_40;
  if (local_40 != (long *)0x0) {
    do {
      if ((((~*(uint *)(plVar9 + 2) & 0x41) == 0) && ((short *)plVar9[3] != (short *)0x0)) &&
         (*(short *)plVar9[3] != 0x11)) {
        pcVar8 = uv__strdup((char *)plVar9[1]);
        puVar7->name = pcVar8;
        psVar1 = (short *)plVar9[3];
        if (*psVar1 == 10) {
          uVar11 = *(undefined4 *)psVar1;
          iVar12 = *(in_addr_t *)(psVar1 + 2);
          uVar13 = *(undefined4 *)(psVar1 + 4);
          uVar14 = *(undefined4 *)(psVar1 + 6);
          uVar3 = *(undefined8 *)(psVar1 + 10);
          *(undefined8 *)((long)&puVar7->address + 0xc) = *(undefined8 *)(psVar1 + 6);
          *(undefined8 *)((long)&puVar7->address + 0x14) = uVar3;
        }
        else {
          uVar11 = *(undefined4 *)psVar1;
          iVar12 = *(in_addr_t *)(psVar1 + 2);
          uVar13 = *(undefined4 *)(psVar1 + 4);
          uVar14 = *(undefined4 *)(psVar1 + 6);
        }
        *(undefined4 *)&puVar7->address = uVar11;
        (puVar7->address).address4.sin_addr.s_addr = iVar12;
        *(undefined4 *)((long)&puVar7->address + 8) = uVar13;
        *(undefined4 *)((long)&puVar7->address + 0xc) = uVar14;
        psVar1 = (short *)plVar9[4];
        if (*psVar1 == 10) {
          uVar11 = *(undefined4 *)psVar1;
          iVar12 = *(in_addr_t *)(psVar1 + 2);
          uVar13 = *(undefined4 *)(psVar1 + 4);
          uVar14 = *(undefined4 *)(psVar1 + 6);
          uVar3 = *(undefined8 *)(psVar1 + 10);
          *(undefined8 *)((long)&puVar7->netmask + 0xc) = *(undefined8 *)(psVar1 + 6);
          *(undefined8 *)((long)&puVar7->netmask + 0x14) = uVar3;
        }
        else {
          uVar11 = *(undefined4 *)psVar1;
          iVar12 = *(in_addr_t *)(psVar1 + 2);
          uVar13 = *(undefined4 *)(psVar1 + 4);
          uVar14 = *(undefined4 *)(psVar1 + 6);
        }
        *(undefined4 *)&puVar7->netmask = uVar11;
        (puVar7->netmask).netmask4.sin_addr.s_addr = iVar12;
        *(undefined4 *)((long)&puVar7->netmask + 8) = uVar13;
        *(undefined4 *)((long)&puVar7->netmask + 0xc) = uVar14;
        puVar7->is_internal = *(uint *)(plVar9 + 2) >> 3 & 1;
        puVar7 = puVar7 + 1;
      }
      plVar9 = (long *)*plVar9;
    } while (plVar9 != (long *)0x0);
    if (local_40 != (long *)0x0) {
      local_38 = local_40;
      plVar10 = local_40;
      do {
        if ((((~*(uint *)(plVar10 + 2) & 0x41) == 0) && ((short *)plVar10[3] != (short *)0x0)) &&
           ((*(short *)plVar10[3] == 0x11 && (0 < *count)))) {
          pcVar8 = (*addresses)->phys_addr;
          iVar4 = 0;
          do {
            iVar5 = strcmp(((uv_interface_address_t *)(pcVar8 + -8))->name,(char *)plVar10[1]);
            if (iVar5 == 0) {
              lVar2 = plVar10[3];
              *(undefined2 *)(pcVar8 + 4) = *(undefined2 *)(lVar2 + 0x10);
              *(undefined4 *)pcVar8 = *(undefined4 *)(lVar2 + 0xc);
            }
            else {
              pcVar8[4] = '\0';
              pcVar8[5] = '\0';
              pcVar8[0] = '\0';
              pcVar8[1] = '\0';
              pcVar8[2] = '\0';
              pcVar8[3] = '\0';
            }
            iVar4 = iVar4 + 1;
            pcVar8 = pcVar8 + 0x50;
          } while (iVar4 < *count);
        }
        plVar10 = (long *)*plVar10;
        plVar9 = local_38;
      } while (plVar10 != (long *)0x0);
      goto LAB_00470c9f;
    }
  }
  plVar9 = (long *)0x0;
LAB_00470c9f:
  freeifaddrs(plVar9);
  return 0;
}

Assistant:

int uv_interface_addresses(uv_interface_address_t** addresses, int* count) {
#ifndef HAVE_IFADDRS_H
  *count = 0;
  *addresses = NULL;
  return UV_ENOSYS;
#else
  struct ifaddrs *addrs, *ent;
  uv_interface_address_t* address;
  int i;
  struct sockaddr_ll *sll;

  *count = 0;
  *addresses = NULL;

  if (getifaddrs(&addrs))
    return UV__ERR(errno);

  /* Count the number of interfaces */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    (*count)++;
  }

  if (*count == 0) {
    freeifaddrs(addrs);
    return 0;
  }

  *addresses = uv__malloc(*count * sizeof(**addresses));
  if (!(*addresses)) {
    freeifaddrs(addrs);
    return UV_ENOMEM;
  }

  address = *addresses;

  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    address->name = uv__strdup(ent->ifa_name);

    if (ent->ifa_addr->sa_family == AF_INET6) {
      address->address.address6 = *((struct sockaddr_in6*) ent->ifa_addr);
    } else {
      address->address.address4 = *((struct sockaddr_in*) ent->ifa_addr);
    }

    if (ent->ifa_netmask->sa_family == AF_INET6) {
      address->netmask.netmask6 = *((struct sockaddr_in6*) ent->ifa_netmask);
    } else {
      address->netmask.netmask4 = *((struct sockaddr_in*) ent->ifa_netmask);
    }

    address->is_internal = !!(ent->ifa_flags & IFF_LOOPBACK);

    address++;
  }

  /* Fill in physical addresses for each interface */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFPHYS))
      continue;

    address = *addresses;

    for (i = 0; i < (*count); i++) {
      if (strcmp(address->name, ent->ifa_name) == 0) {
        sll = (struct sockaddr_ll*)ent->ifa_addr;
        memcpy(address->phys_addr, sll->sll_addr, sizeof(address->phys_addr));
      } else {
        memset(address->phys_addr, 0, sizeof(address->phys_addr));
      }
      address++;
    }
  }

  freeifaddrs(addrs);

  return 0;
#endif
}